

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O0

void __thiscall
glslang::TRemapIdTraverser::visitSymbol(TRemapIdTraverser *this,TIntermSymbol *symbol)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  TQualifier *this_00;
  undefined4 extraout_var_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>_>_>
  *pmVar3;
  TString *__x;
  uint extraout_var_01;
  pointer ppVar4;
  undefined4 extraout_var_02;
  uint64_t id;
  _Self local_30;
  const_iterator it;
  TShaderInterface si;
  bool remapped;
  TQualifier *qualifier;
  TIntermSymbol *symbol_local;
  TRemapIdTraverser *this_local;
  
  iVar2 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
  this_00 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x58))();
  it._M_node._7_1_ = 0;
  bVar1 = TQualifier::isLinkable(this_00);
  if ((bVar1) || ((*(ulong *)&this_00->field_0x8 >> 7 & 0x1ff) != 0)) {
    iVar2 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    it._M_node._0_4_ = TType::getShaderInterface((TType *)CONCAT44(extraout_var_00,iVar2));
    pmVar3 = &TIdMaps::operator[][abi_cxx11_(this->idMaps,(ulong)(TShaderInterface)it._M_node)->
              super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>_>_>
    ;
    __x = getNameForIdMap_abi_cxx11_(symbol);
    local_30._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>_>_>
         ::find(pmVar3,__x);
    pmVar3 = &TIdMaps::operator[][abi_cxx11_(this->idMaps,(ulong)(TShaderInterface)it._M_node)->
              super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>_>_>
    ;
    id = (uint64_t)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>_>_>
         ::end(pmVar3);
    bVar1 = std::operator!=(&local_30,(_Self *)&id);
    if (bVar1) {
      (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])();
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_long_long>_>
               ::operator->(&local_30);
      (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x31])
                (symbol,((ulong)extraout_var_01 & 0xff000000) << 0x20 |
                        ppVar4->second & 0xffffffffffffffU);
      it._M_node._7_1_ = 1;
    }
  }
  if ((it._M_node._7_1_ & 1) == 0) {
    iVar2 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])();
    (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x31])
              (symbol,CONCAT44(extraout_var_02,iVar2) + this->idShift);
  }
  return;
}

Assistant:

virtual void visitSymbol(TIntermSymbol* symbol)
    {
        const TQualifier& qualifier = symbol->getType().getQualifier();
        bool remapped = false;
        if (qualifier.isLinkable() || qualifier.builtIn != EbvNone) {
            TShaderInterface si = symbol->getType().getShaderInterface();
            auto it = idMaps[si].find(getNameForIdMap(symbol));
            if (it != idMaps[si].end()) {
                uint64_t id = (symbol->getId() & ~TSymbolTable::uniqueIdMask) |
                    (it->second & TSymbolTable::uniqueIdMask);
                symbol->changeId(id);
                remapped = true;
            }
        }
        if (!remapped)
            symbol->changeId(symbol->getId() + idShift);
    }